

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void solveMatrixT(HighsInt X_Start,HighsInt x_end,HighsInt y_start,HighsInt y_end,HighsInt *t_index,
                 double *t_value,double t_pivot,HighsInt *rhs_count,HighsInt *rhs_index,
                 double *rhs_array)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = 0.0;
  for (lVar4 = (long)X_Start; lVar4 < x_end; lVar4 = lVar4 + 1) {
    dVar7 = dVar7 + t_value[lVar4] * rhs_array[t_index[lVar4]];
  }
  if (1e-14 < ABS(dVar7)) {
    iVar3 = *rhs_count;
    for (lVar4 = (long)y_start; lVar4 < y_end; lVar4 = lVar4 + 1) {
      iVar2 = t_index[lVar4];
      dVar8 = rhs_array[iVar2];
      dVar1 = t_value[lVar4];
      if ((dVar8 == 0.0) && (!NAN(dVar8))) {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        rhs_index[lVar5] = iVar2;
      }
      dVar8 = dVar1 * (-dVar7 / t_pivot) + dVar8;
      uVar6 = -(ulong)(ABS(dVar8) < 1e-14);
      rhs_array[iVar2] = (double)(~uVar6 & (ulong)dVar8 | uVar6 & 0x358dee7a4ad4b81f);
    }
    *rhs_count = iVar3;
  }
  return;
}

Assistant:

static void solveMatrixT(const HighsInt X_Start, const HighsInt x_end,
                         const HighsInt y_start, const HighsInt y_end,
                         const HighsInt* t_index, const double* t_value,
                         const double t_pivot, HighsInt* rhs_count,
                         HighsInt* rhs_index, double* rhs_array) {
  // Collect by X
  double pivot_multiplier = 0;
  for (HighsInt k = X_Start; k < x_end; k++)
    pivot_multiplier += t_value[k] * rhs_array[t_index[k]];

  // Scatter by Y
  if (fabs(pivot_multiplier) > kHighsTiny) {
    HighsInt work_count = *rhs_count;

    pivot_multiplier /= t_pivot;
    for (HighsInt k = y_start; k < y_end; k++) {
      const HighsInt index = t_index[k];
      const double value0 = rhs_array[index];
      const double value1 = value0 - pivot_multiplier * t_value[k];
      if (value0 == 0) rhs_index[work_count++] = index;
      rhs_array[index] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }

    *rhs_count = work_count;
  }
}